

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Result::Result(Result *this,CURLcode *code)

{
  CURLcode CVar1;
  
  this->curl_code = CURLE_OK;
  this->http_response_code = 0;
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  (this->msg)._M_string_length = 0;
  (this->msg).field_2._M_local_buf[0] = '\0';
  (this->body)._M_dataplus._M_p = (pointer)&(this->body).field_2;
  (this->body)._M_string_length = 0;
  (this->body).field_2._M_local_buf[0] = '\0';
  CVar1 = *code;
  this->curl_code = CVar1;
  curl_easy_strerror(CVar1);
  std::__cxx11::string::assign((char *)&this->msg);
  return;
}

Assistant:

Result(const CURLcode& code) {
            curl_code = code;
            msg = curl_easy_strerror(code);
        }